

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneofFields
          (MessageGenerator *this,Printer *p,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar1;
  bool bVar2;
  LogMessage *pLVar3;
  size_type sVar4;
  const_reference ppFVar5;
  DescriptorStringView value;
  Sub *local_2d8;
  basic_string_view<char,_std::char_traits<char>_> local_280;
  undefined1 local_269;
  anon_class_24_3_aed88e1c_for_cb local_268;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  Sub *local_200;
  Sub local_1f8;
  Sub local_140;
  iterator local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_78;
  undefined1 local_68 [8];
  OneofDescriptor *oneof;
  undefined1 local_49;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_20;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  Printer *p_local;
  MessageGenerator *this_local;
  
  local_20 = fields;
  fields_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)p;
  p_local = (Printer *)this;
  bVar2 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty(fields);
  local_49 = 0;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"!fields.empty()");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
               ,0x1141,local_48._M_len,local_48._M_str);
    local_49 = 1;
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar3);
  }
  if ((local_49 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  sVar4 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::size(local_20);
  pvVar1 = fields_local;
  if (sVar4 == 1) {
    ppFVar5 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](local_20,0);
    GenerateSerializeOneField(this,(Printer *)pvVar1,*ppFVar5,-1);
  }
  else {
    ppFVar5 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](local_20,0);
    local_68 = (undefined1  [8])FieldDescriptor::containing_oneof(*ppFVar5);
    pvVar1 = fields_local;
    local_269 = 1;
    local_200 = &local_1f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"name",&local_221);
    value = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)local_68);
    io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_1f8,&local_220,value);
    local_200 = &local_140;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"cases",&local_249);
    local_268.fields = local_20;
    local_268.p = (Printer **)&fields_local;
    local_268.this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneofFields(google::protobuf::io::Printer*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&)::__0>
              (&local_140,&local_248,&local_268);
    local_269 = 0;
    local_88 = &local_1f8;
    local_80 = 2;
    v._M_len = 2;
    v._M_array = local_88;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_78._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_280,
               "\n            switch (this_.$name$_case()) {\n              $cases$;\n              default:\n                break;\n            }\n          "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (pvVar1,local_78._M_allocated_capacity,local_78._8_8_,local_280._M_len,
               local_280._M_str);
    local_2d8 = (Sub *)&local_88;
    do {
      local_2d8 = local_2d8 + -1;
      io::Printer::Sub::~Sub(local_2d8);
    } while (local_2d8 != &local_1f8);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneofFields(
    io::Printer* p, const std::vector<const FieldDescriptor*>& fields) {
  ABSL_CHECK(!fields.empty());
  if (fields.size() == 1) {
    GenerateSerializeOneField(p, fields[0], -1);
    return;
  }
  // We have multiple mutually exclusive choices.  Emit a switch statement.
  const OneofDescriptor* oneof = fields[0]->containing_oneof();
  p->Emit({{"name", oneof->name()},
           {"cases",
            [&] {
              for (const auto* field : fields) {
                p->Emit({{"Name", UnderscoresToCamelCase(field->name(), true)},
                         {"body",
                          [&] {
                            field_generators_.get(field)
                                .GenerateSerializeWithCachedSizesToArray(p);
                          }}},
                        R"cc(
                          case k$Name$: {
                            $body$;
                            break;
                          }
                        )cc");
              }
            }}},
          R"cc(
            switch (this_.$name$_case()) {
              $cases$;
              default:
                break;
            }
          )cc");
}